

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void OPNCheckNativeSampleRate(FM_OPN *OPN)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = 0x90;
  if ((OPN->type & 4) == 0) {
    uVar2 = 0x48;
  }
  uVar3 = (OPN->ST).rate - (int)((OPN->ST).clock / uVar2);
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  OPN->smpRateNative = uVar1 < 3;
  return;
}

Assistant:

static void OPNCheckNativeSampleRate(FM_OPN *OPN)
{
	UINT32 pres;
	UINT32 nativeSRate;
	int sRateDiff;
	
	pres = 6*12;	// default prescaler
	if (OPN->type & TYPE_6CH)
		pres *= 2;
	nativeSRate = OPN->ST.clock / pres;
	sRateDiff = (int)OPN->ST.rate - (int)nativeSRate;
	OPN->smpRateNative = (abs(sRateDiff) <= 2);
	
	return;
}